

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O2

int getQuadHutCst(uint64_t low20)

{
  uint64_t uVar1;
  uint64_t *puVar2;
  
  puVar2 = low20QuadIdeal;
  do {
    uVar1 = *puVar2;
    if (uVar1 == 0) {
      puVar2 = low20QuadClassic;
      do {
        uVar1 = *puVar2;
        if (uVar1 == 0) {
          puVar2 = low20QuadHutNormal;
          do {
            uVar1 = *puVar2;
            if (uVar1 == 0) {
              puVar2 = low20QuadHutBarely;
              do {
                uVar1 = *puVar2;
                if (uVar1 == 0) {
                  return 0;
                }
                puVar2 = puVar2 + 1;
              } while (uVar1 != low20);
              return 4;
            }
            puVar2 = puVar2 + 1;
          } while (uVar1 != low20);
          return 3;
        }
        puVar2 = puVar2 + 1;
      } while (uVar1 != low20);
      return 2;
    }
    puVar2 = puVar2 + 1;
  } while (uVar1 != low20);
  return 1;
}

Assistant:

int getQuadHutCst(uint64_t low20)
{
    const uint64_t *cst;
    for (cst = low20QuadIdeal; *cst; cst++)
        if (*cst == low20)
            return CST_IDEAL;
    for (cst = low20QuadClassic; *cst; cst++)
        if (*cst == low20)
            return CST_CLASSIC;
    for (cst = low20QuadHutNormal; *cst; cst++)
        if (*cst == low20)
            return CST_NORMAL;
    for (cst = low20QuadHutBarely; *cst; cst++)
        if (*cst == low20)
            return CST_BARELY;
    return CST_NONE;
}